

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_paramhlp.c
# Opt level: O1

ParameterError str2unum(long *val,char *str)

{
  ParameterError PVar1;
  
  PVar1 = str2num(val,str);
  if (PVar1 == PARAM_OK) {
    PVar1 = (ParameterError)(*val >> 0x3f) & PARAM_NEGATIVE_NUMERIC;
  }
  return PVar1;
}

Assistant:

ParameterError str2unum(long *val, const char *str)
{
  ParameterError result = str2num(val, str);
  if(result != PARAM_OK)
    return result;
  if(*val < 0)
    return PARAM_NEGATIVE_NUMERIC;

  return PARAM_OK;
}